

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::rfind_lower(StringRef *this,StringRef Str)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  StringRef local_40;
  
  uVar3 = Str.Length;
  sVar4 = 0xffffffffffffffff;
  if (uVar3 <= this->Length) {
    sVar4 = (this->Length - uVar3) + 1;
    do {
      bVar5 = sVar4 == 0;
      sVar4 = sVar4 - 1;
      if (bVar5) {
        return 0xffffffffffffffff;
      }
      uVar1 = this->Length;
      uVar2 = sVar4;
      if (uVar1 < sVar4) {
        uVar2 = uVar1;
      }
      local_40.Data = this->Data + uVar2;
      local_40.Length = uVar1 - uVar2;
      if (uVar3 <= uVar1 - uVar2) {
        local_40.Length = uVar3;
      }
      bVar5 = equals_lower(&local_40,Str);
    } while (!bVar5);
  }
  return sVar4;
}

Assistant:

size_t StringRef::rfind_lower(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals_lower(Str))
      return i;
  }
  return npos;
}